

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# init.c
# Opt level: O1

parser_error parse_flavor_flavor(parser *p)

{
  byte bVar1;
  _Bool _Var2;
  undefined1 uVar3;
  uint uVar4;
  int iVar6;
  parser_error pVar7;
  void *pvVar8;
  undefined8 *v;
  char *pcVar9;
  size_t sVar10;
  char *s2;
  wchar_t wVar5;
  
  pvVar8 = parser_priv(p);
  v = (undefined8 *)mem_zalloc(0x20);
  v[1] = pvVar8;
  uVar4 = parser_getuint(p,"index");
  *(uint *)(v + 2) = uVar4;
  *(undefined1 *)((long)v + 0x14) = (undefined1)flavor_tval;
  *(wchar_t *)(v + 3) = flavor_glyph;
  _Var2 = parser_hasval(p,"sval");
  if (_Var2) {
    bVar1 = *(byte *)((long)v + 0x14);
    pcVar9 = parser_getsym(p,"sval");
    wVar5 = lookup_sval((uint)bVar1,pcVar9);
    uVar3 = (undefined1)wVar5;
  }
  else {
    uVar3 = 0;
  }
  *(undefined1 *)((long)v + 0x15) = uVar3;
  pcVar9 = parser_getsym(p,"attr");
  sVar10 = strlen(pcVar9);
  if (sVar10 == 1) {
    iVar6 = color_char_to_attr(*pcVar9);
  }
  else {
    iVar6 = color_text_to_attr(pcVar9);
  }
  if (iVar6 < 0) {
    pVar7 = PARSE_ERROR_INVALID_COLOR;
  }
  else {
    *(char *)((long)v + 0x16) = (char)iVar6;
    _Var2 = parser_hasval(p,"desc");
    if (_Var2) {
      pcVar9 = (char *)*v;
      s2 = parser_getstr(p,"desc");
      pcVar9 = string_append(pcVar9,s2);
      *v = pcVar9;
    }
    parser_setpriv(p,v);
    pVar7 = PARSE_ERROR_NONE;
  }
  return pVar7;
}

Assistant:

static enum parser_error parse_flavor_flavor(struct parser *p) {
	struct flavor *h = parser_priv(p);
	struct flavor *f = mem_zalloc(sizeof *f);

	const char *attr;
	int d_attr;

	f->next = h;

	f->fidx = parser_getuint(p, "index");
	f->tval = flavor_tval;
	f->d_char = flavor_glyph;

	if (parser_hasval(p, "sval"))
		f->sval = lookup_sval(f->tval, parser_getsym(p, "sval"));
	else
		f->sval = SV_UNKNOWN;

	attr = parser_getsym(p, "attr");
	if (strlen(attr) == 1)
		d_attr = color_char_to_attr(attr[0]);
	else
		d_attr = color_text_to_attr(attr);

	if (d_attr < 0)
		return PARSE_ERROR_INVALID_COLOR;
	f->d_attr = d_attr;

	if (parser_hasval(p, "desc"))
		f->text = string_append(f->text, parser_getstr(p, "desc"));

	parser_setpriv(p, f);

	return PARSE_ERROR_NONE;
}